

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.hpp
# Opt level: O0

void __thiscall test::test(test *this,char *functionName)

{
  ostream *poVar1;
  char *functionName_local;
  test *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,functionName);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

test(const char *functionName)
    {
        std::cout << "-------------------------------------------------------------------" << std::endl;
        std::cout << functionName << std::endl;
        std::cout << "-------------------------------------------------------------------" << std::endl;
    }